

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O1

void TestLength<unsigned_long_long>(char *length_spec)

{
  TestLength<unsigned_long_long,int>(length_spec,0x2a);
  TestLength<unsigned_long_long,int>(length_spec,-0x2a);
  TestLength<unsigned_long_long,unsigned_long_long>(length_spec,0);
  TestLength<unsigned_long_long,unsigned_long_long>(length_spec,0xffffffffffffffff);
  TestLength<unsigned_long_long,long_long>(length_spec,-1);
  TestLength<unsigned_long_long,short>(length_spec,-0x8000);
  TestLength<unsigned_long_long,unsigned_short>(length_spec,0xffff);
  TestLength<unsigned_long_long,int>(length_spec,-0x80000000);
  TestLength<unsigned_long_long,int>(length_spec,0x7fffffff);
  TestLength<unsigned_long_long,unsigned_int>(length_spec,0);
  TestLength<unsigned_long_long,unsigned_int>(length_spec,0xffffffff);
  TestLength<unsigned_long_long,long_long>(length_spec,-0x8000000000000000);
  TestLength<unsigned_long_long,long_long>(length_spec,0x7fffffffffffffff);
  TestLength<unsigned_long_long,unsigned_long_long>(length_spec,0);
  TestLength<unsigned_long_long,unsigned_long_long>(length_spec,0xffffffffffffffff);
  return;
}

Assistant:

void TestLength(const char *length_spec) {
  T min = std::numeric_limits<T>::min(), max = std::numeric_limits<T>::max();
  TestLength<T>(length_spec, 42);
  TestLength<T>(length_spec, -42);
  TestLength<T>(length_spec, min);
  TestLength<T>(length_spec, max);
  TestLength<T>(length_spec, static_cast<long long>(min) - 1);
  unsigned long long long_long_max = std::numeric_limits<long long>::max();
  if (static_cast<unsigned long long>(max) < long_long_max)
    TestLength<T>(length_spec, static_cast<long long>(max) + 1);
  TestLength<T>(length_spec, std::numeric_limits<short>::min());
  TestLength<T>(length_spec, std::numeric_limits<unsigned short>::max());
  TestLength<T>(length_spec, std::numeric_limits<int>::min());
  TestLength<T>(length_spec, std::numeric_limits<int>::max());
  TestLength<T>(length_spec, std::numeric_limits<unsigned>::min());
  TestLength<T>(length_spec, std::numeric_limits<unsigned>::max());
  TestLength<T>(length_spec, std::numeric_limits<long long>::min());
  TestLength<T>(length_spec, std::numeric_limits<long long>::max());
  TestLength<T>(length_spec, std::numeric_limits<unsigned long long>::min());
  TestLength<T>(length_spec, std::numeric_limits<unsigned long long>::max());
}